

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O2

void __thiscall
solitaire::graphics::
SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderClearFailedDuringFrameRendering_Test::TestBody
          (SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderClearFailedDuringFrameRendering_Test
           *this)

{
  WrapperMock *pWVar1;
  bool bVar2;
  TypedExpectation<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
  *this_00;
  undefined1 local_88 [24];
  Buffer BStack_70;
  _Any_data local_68 [2];
  MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&> local_48
  ;
  ReturnAction<int> local_30;
  undefined8 local_20;
  
  pWVar1 = &((this->super_SDLGraphicsSystemWithLoadedTexture).
             super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.sdlMock.
            rawPointer)->super_WrapperMock;
  local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = (_func_int **)0x2;
  testing::internal::PointerMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
              *)local_68,(PointerMatcher *)&local_48);
  SDL::WrapperMock::gmock_renderPresent
            ((MockSpec<void_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
              *)local_88,pWVar1,
             (Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
              *)local_68);
  testing::internal::GetWithoutMatchers();
  testing::internal::
  MockSpec<void_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>::
  InternalExpectedAt((MockSpec<void_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
                      *)local_88,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                     ,0x193,"*sdlMock","renderPresent(Pointer(rendererPtr))");
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>::
  ~MatcherBase((MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
                *)(local_88 + 8));
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>::
  ~MatcherBase((MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
                *)local_68);
  pWVar1 = &((this->super_SDLGraphicsSystemWithLoadedTexture).
             super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.sdlMock.
            rawPointer)->super_WrapperMock;
  local_20 = 2;
  testing::internal::PointerMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
              *)&local_48,(PointerMatcher *)&local_20);
  SDL::WrapperMock::gmock_renderClear
            ((MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
              *)local_88,pWVar1,
             (Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
              *)&local_48);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
            ::InternalExpectedAt
                      ((MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
                        *)local_88,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x194,"*sdlMock","renderClear(Pointer(rendererPtr))");
  testing::internal::ReturnAction<int>::ReturnAction(&local_30,-1);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
              *)local_68,(ReturnAction *)&local_30);
  testing::internal::
  TypedExpectation<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
  ::WillOnce(this_00,(Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
                      *)local_68);
  std::_Function_base::~_Function_base((_Function_base *)local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>::
  ~MatcherBase((MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
                *)(local_88 + 8));
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>::
  ~MatcherBase(&local_48);
  local_88._0_8_ = local_88 + 0x10;
  local_88._16_8_ = (VTable *)0x0;
  BStack_70.ptr = (void *)0x0;
  local_88._8_8_ = (_func_int **)0x0;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    SDLGraphicsSystem::renderFrame
              (&(this->super_SDLGraphicsSystemWithLoadedTexture).
                super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.system);
  }
  std::__cxx11::string::assign(local_88);
  testing::Message::Message((Message *)local_68);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_48,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x195,(char *)local_88._0_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_68);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
  if ((long *)local_68[0]._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_68[0]._0_8_ + 8))();
  }
  std::__cxx11::string::~string((string *)local_88);
  SDLGraphicsSystemWithLoadedTexture::expectQuitSystemWithLoadedTexture
            (&this->super_SDLGraphicsSystemWithLoadedTexture);
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemWithLoadedTexture,
       throwIfSDLRenderClearFailedDuringFrameRendering)
{
    EXPECT_CALL(*sdlMock, renderPresent(Pointer(rendererPtr)));
    EXPECT_CALL(*sdlMock, renderClear(Pointer(rendererPtr))).WillOnce(Return(failure));
    EXPECT_THROW(system.renderFrame(), std::runtime_error);
    expectQuitSystemWithLoadedTexture();
}